

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_quad_mesh_builder.cc
# Opt level: O0

shared_ptr<lf::mesh::Mesh> __thiscall
lf::mesh::utils::TPQuadMeshBuilder::Build(TPQuadMeshBuilder *this)

{
  allocator<unsigned_int> *this_00;
  double dVar1;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  format_string_t<unsigned_int_&,_Eigen::Matrix<double,_2,_4>_&> fmt;
  initializer_list<unsigned_int> __l;
  format_string_t<int_&,_Eigen::Transpose<Eigen::Matrix<double,_2,_1>_>_> fmt_00;
  format_string_t<const_unsigned_int_&,_const_unsigned_int_&,_const_unsigned_int_&,_const_double_&,_const_double_&>
  fmt_01;
  value_type vVar2;
  size_type sVar3;
  Scalar *pSVar4;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  ulong uVar7;
  pointer pMVar8;
  reference pvVar9;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *pCVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  TPQuadMeshBuilder *in_RSI;
  shared_ptr<lf::mesh::Mesh> sVar12;
  undefined1 local_2a0 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_298;
  span<const_unsigned_int,_18446744073709551615UL> local_290;
  RefElType local_279;
  char *local_278;
  double local_270;
  source_loc local_268;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> local_210;
  int local_1f0 [2];
  undefined1 local_1e8 [8];
  Matrix<double,_2,_4,_0,_2,_4> quad_geo;
  value_type local_1a0;
  value_type local_19c;
  value_type local_198;
  value_type local_194;
  iterator local_190;
  size_type local_188;
  undefined1 local_180 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_index_list;
  size_type j_1;
  size_type i_1;
  size_type quad_cnt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_idx;
  Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_130;
  char *local_128;
  size_t local_120;
  source_loc local_118;
  double local_100;
  double local_f8;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_f0;
  int local_cc;
  undefined1 local_c8 [8];
  coord_t node_coord;
  uint local_b0;
  uint local_ac;
  size_type i;
  size_type j;
  int node_cnt;
  allocator<unsigned_int> local_91;
  undefined1 local_90 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> v_idx;
  source_loc local_68;
  double local_50;
  double hy;
  double hx;
  double y_size;
  double x_size;
  uint local_28;
  uint no_of_vertices;
  uint no_of_edges;
  uint no_of_cells;
  size_type ny;
  size_type nx;
  TPQuadMeshBuilder *this_local;
  
  no_of_cells = (in_RSI->super_StructuredMeshBuilder).num_of_x_cells_;
  no_of_edges = (in_RSI->super_StructuredMeshBuilder).num_of_y_cells_;
  no_of_vertices = no_of_cells * no_of_edges;
  local_28 = (no_of_cells + 1) * no_of_edges + no_of_cells * (no_of_edges + 1);
  x_size._4_4_ = (no_of_cells + 1) * (no_of_edges + 1);
  this_local = this;
  if (no_of_vertices == 0) {
    std::shared_ptr<lf::mesh::Mesh>::shared_ptr((shared_ptr<lf::mesh::Mesh> *)this,(nullptr_t)0x0);
    _Var11._M_pi = extraout_RDX;
  }
  else {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).top_right_corner_,0);
    dVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
    y_size = dVar1 - *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).top_right_corner_,1);
    dVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                        &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
    hx = dVar1 - *pSVar4;
    if ((y_size <= 0.0) || (hx <= 0.0)) {
      std::shared_ptr<lf::mesh::Mesh>::shared_ptr((shared_ptr<lf::mesh::Mesh> *)this,(nullptr_t)0x0)
      ;
      _Var11._M_pi = extraout_RDX_00;
    }
    else {
      hy = y_size / (double)no_of_cells;
      local_50 = hx / (double)no_of_edges;
      p_Var5 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               Logger();
      peVar6 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var5);
      spdlog::source_loc::source_loc
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_quad_mesh_builder.cc"
                 ,0x2c,"Build");
      v_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_362d35;
      fmt_01.str_.size_ = 0x45;
      fmt_01.str_.data_ = "TPQuadmesh: {} cells, {} edges, {} vertices, meshwidths hx/hy = {}/{}";
      loc.line = local_68.line;
      loc._12_4_ = local_68._12_4_;
      loc.filename = local_68.filename;
      loc.funcname = local_68.funcname;
      spdlog::logger::
      log<unsigned_int_const&,unsigned_int_const&,unsigned_int_const&,double_const&,double_const&>
                (peVar6,loc,debug,fmt_01,&no_of_vertices,&local_28,(uint *)((long)&x_size + 4),&hy,
                 &local_50);
      uVar7 = (ulong)x_size._4_4_;
      std::allocator<unsigned_int>::allocator(&local_91);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,uVar7,&local_91);
      std::allocator<unsigned_int>::~allocator(&local_91);
      i = 0;
      for (local_ac = 0; local_ac <= no_of_edges; local_ac = local_ac + 1) {
        for (local_b0 = 0; local_b0 <= no_of_cells; local_b0 = local_b0 + 1) {
          local_cc = 2;
          Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix<int>
                    ((Matrix<double,_2,_1,_0,_2,_1> *)local_c8,&local_cc);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_f8 = (double)local_b0 * hy + *pSVar4;
          Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
                    (&local_f0,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_c8,
                     &local_f8);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_100 = (double)local_ac * local_50 + *pSVar4;
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                    (&local_f0,&local_100);
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer
                    (&local_f0);
          p_Var5 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar6 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          spdlog::source_loc::source_loc
                    (&local_118,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_quad_mesh_builder.cc"
                     ,0x39,"Build");
          local_128 = "Adding vertex {}: {}";
          local_120 = 0x14;
          local_130.m_matrix =
               (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_c8);
          fmt_00.str_.size_ = local_120;
          fmt_00.str_.data_ = local_128;
          loc_00.line = local_118.line;
          loc_00._12_4_ = local_118._12_4_;
          loc_00.filename = local_118.filename;
          loc_00.funcname = local_118.funcname;
          spdlog::logger::log<int&,Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>>
                    (peVar6,loc_00,trace,fmt_00,(int *)&i,&local_130);
          pMVar8 = std::
                   unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                   operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
                    ((Matrix<double,_1,1,0,_1,1> *)
                     &t_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_c8);
          vVar2 = (*pMVar8->_vptr_MeshFactory[2])
                            (pMVar8,&t_idx.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                              (long)(int)i);
          *pvVar9 = vVar2;
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                    ((Matrix<double,__1,_1,_0,__1,_1> *)
                     &t_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          i = i + 1;
        }
      }
      uVar7 = (ulong)no_of_vertices;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quad_cnt,uVar7,
                 (allocator<unsigned_int> *)((long)&i_1 + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
      j_1 = 0;
      for (vertex_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          vertex_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < no_of_cells;
          vertex_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               vertex_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        for (vertex_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            (uint)vertex_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage < no_of_edges;
            vertex_index_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 (uint)vertex_index_list.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1) {
          sVar3 = VertexIndex(in_RSI,vertex_index_list.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (uint)vertex_index_list.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                              (ulong)sVar3);
          local_1a0 = *pvVar9;
          sVar3 = VertexIndex(in_RSI,vertex_index_list.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                              (uint)vertex_index_list.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                              (ulong)sVar3);
          local_19c = *pvVar9;
          sVar3 = VertexIndex(in_RSI,vertex_index_list.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                              (uint)vertex_index_list.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                              (ulong)sVar3);
          local_198 = *pvVar9;
          sVar3 = VertexIndex(in_RSI,vertex_index_list.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (uint)vertex_index_list.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                              (ulong)sVar3);
          local_194 = *pvVar9;
          local_190 = &local_1a0;
          local_188 = 4;
          this_00 = (allocator<unsigned_int> *)
                    ((long)quad_geo.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                           m_storage.m_data.array + 0x3f);
          std::allocator<unsigned_int>::allocator(this_00);
          __l._M_len = local_188;
          __l._M_array = local_190;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_180,__l,this_00);
          std::allocator<unsigned_int>::~allocator
                    ((allocator<unsigned_int> *)
                     ((long)quad_geo.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.
                            m_storage.m_data.array + 0x3f));
          local_1f0[1] = 2;
          local_1f0[0] = 4;
          Eigen::Matrix<double,2,4,0,2,4>::Matrix<int,int>
                    ((Matrix<double,2,4,0,2,4> *)local_1e8,local_1f0 + 1,local_1f0);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_218 = (double)vertex_index_list.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * hy + *pSVar4
          ;
          Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator<<
                    (&local_210,(DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_1e8,
                     &local_218);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_220 = (double)(vertex_index_list.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) * hy +
                      *pSVar4;
          pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                              (&local_210,&local_220);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_228 = (double)(vertex_index_list.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) * hy +
                      *pSVar4;
          pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                              (pCVar10,&local_228);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,0);
          local_230 = (double)vertex_index_list.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * hy + *pSVar4
          ;
          pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                              (pCVar10,&local_230);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_238 = (double)(uint)vertex_index_list.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage * local_50 +
                      *pSVar4;
          pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                              (pCVar10,&local_238);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_240 = (double)(uint)vertex_index_list.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage * local_50 +
                      *pSVar4;
          pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                              (pCVar10,&local_240);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_248 = (double)((uint)vertex_index_list.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) *
                      local_50 + *pSVar4;
          pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                              (pCVar10,&local_248);
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                              &(in_RSI->super_StructuredMeshBuilder).bottom_left_corner_,1);
          local_250 = (double)((uint)vertex_index_list.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) *
                      local_50 + *pSVar4;
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                    (pCVar10,&local_250);
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::~CommaInitializer
                    (&local_210);
          p_Var5 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar6 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          spdlog::source_loc::source_loc
                    (&local_268,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/tp_quad_mesh_builder.cc"
                     ,0x54,"Build");
          local_278 = "Adding quad {}:\n{}";
          local_270 = 8.89318162514244e-323;
          fmt.str_.size_ = 0x12;
          fmt.str_.data_ = "Adding quad {}:\n{}";
          loc_01.line = local_268.line;
          loc_01._12_4_ = local_268._12_4_;
          loc_01.filename = local_268.filename;
          loc_01.funcname = local_268.funcname;
          spdlog::logger::log<unsigned_int&,Eigen::Matrix<double,2,4,0,2,4>&>
                    (peVar6,loc_01,trace,fmt,&j_1,(Matrix<double,_2,_4,_0,_2,_4> *)local_1e8);
          pMVar8 = std::
                   unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                   operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
          local_279 = (RefElType)lf::base::RefEl::kQuad();
          std::span<const_unsigned_int,_18446744073709551615UL>::
          span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                    (&local_290,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_180);
          std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,2,4,0,2,4>&>
                    ((Matrix<double,_2,_4,_0,_2,_4> *)local_2a0);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::QuadO1,std::default_delete<lf::geometry::QuadO1>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_298,
                     (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *
                     )local_2a0);
          vVar2 = (*pMVar8->_vptr_MeshFactory[4])
                            (pMVar8,(ulong)local_279,&local_290,
                             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                              *)&local_298);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quad_cnt,
                              (ulong)j_1);
          *pvVar9 = vVar2;
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_298);
          std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>
                       *)local_2a0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_180);
          j_1 = j_1 + 1;
        }
      }
      pMVar8 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
               operator->(&(in_RSI->super_StructuredMeshBuilder).mesh_factory_);
      (*pMVar8->_vptr_MeshFactory[5])(this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quad_cnt);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
      _Var11._M_pi = extraout_RDX_01;
    }
  }
  sVar12.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  sVar12.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<lf::mesh::Mesh>)
         sVar12.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<mesh::Mesh> TPQuadMeshBuilder::Build() {
  using coord_t = Eigen::Vector2d;
  const size_type nx = num_of_x_cells_;
  const size_type ny = num_of_y_cells_;
  // Total number of entities in the mesh
  // Each triangle is split into two squares
  const unsigned no_of_cells = nx * ny;  // no of rectangles
  const unsigned no_of_edges = (nx + 1) * ny + nx * (ny + 1);
  const unsigned no_of_vertices = (nx + 1) * (ny + 1);
  // No mesh to build
  if (no_of_cells == 0) {
    return nullptr;
  }
  // define rectangle; return if none
  const double x_size = top_right_corner_[0] - bottom_left_corner_[0];
  const double y_size = top_right_corner_[1] - bottom_left_corner_[1];
  if ((x_size <= 0.0) || (y_size <= 0.0)) {
    return nullptr;
  }
  // meshwidths
  const double hx = x_size / nx;
  const double hy = y_size / ny;

  SPDLOG_LOGGER_DEBUG(
      Logger(),
      "TPQuadmesh: {} cells, {} edges, {} vertices, meshwidths hx/hy = {}/{}",
      no_of_cells, no_of_edges, no_of_vertices, hx, hy);

  // Initialize vertices
  std::vector<size_type> v_idx(no_of_vertices);
  int node_cnt = 0;  // index of current vertex: lexicographic numbering
  for (size_type j = 0; j <= ny; ++j) {
    for (size_type i = 0; i <= nx; ++i, ++node_cnt) {
      // Tensor-product node locations
      coord_t node_coord(2);
      node_coord << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[1] + j * hy;
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "Adding vertex {}: {}", node_cnt,
                          node_coord.transpose());

      // Register vertex
      v_idx[node_cnt] = mesh_factory_->AddPoint(node_coord);
    }
  }
  // Set quadrilateral cells
  // Index remapping for cells
  std::vector<size_type> t_idx(no_of_cells);

  size_type quad_cnt = 0;  // index of current triangle
  for (size_type i = 0; i < nx; ++i) {
    for (size_type j = 0; j < ny; ++j, quad_cnt++) {
      // Indices of vertices of quadrilateral (i,j)
      std::vector<size_type> vertex_index_list{
          v_idx[VertexIndex(i, j)], v_idx[VertexIndex(i + 1, j)],
          v_idx[VertexIndex(i + 1, j + 1)], v_idx[VertexIndex(i, j + 1)]};
      // Construct geometry of rectangle
      Eigen::Matrix<double, 2, 4> quad_geo(2, 4);
      quad_geo << bottom_left_corner_[0] + i * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + (i + 1) * hx,
          bottom_left_corner_[0] + i * hx, bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + j * hy,
          bottom_left_corner_[1] + (j + 1) * hy,
          bottom_left_corner_[1] + (j + 1) * hy;
      // Diagnostics
      SPDLOG_LOGGER_TRACE(Logger(), "Adding quad {}:\n{}", quad_cnt, quad_geo);

      // Request production of the cell from the MeshFactory
      // Straight edges will be created as needed
      t_idx[quad_cnt] = mesh_factory_->AddEntity(
          lf::base::RefEl::kQuad(), vertex_index_list,
          std::make_unique<geometry::QuadO1>(quad_geo));
    }
  }
  return mesh_factory_->Build();
}